

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

void ON_Font::GetRunBounds
               (ON_Font *font,wchar_t *text,double font_height_pixels,
               TextHorizontalAlignment horizontal_alignment,TextVerticalAlignment vertical_alignment
               ,ON_2dPoint *bounds_min,ON_2dPoint *bounds_max,int *line_count)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ON_FontGlyphCache *pOVar4;
  ON_FontMetrics *pOVar5;
  uint uVar6;
  double dVar7;
  ON_TextBox text_box;
  ON_wString run;
  ON_2dPoint last_line_basepoint;
  ON_2dVector local_b8;
  ON_TextBox local_a0;
  ON_wString local_80;
  double local_78;
  undefined8 uStack_70;
  double local_60;
  ON_2dPoint local_58;
  double local_48;
  undefined8 uStack_40;
  
  *line_count = 0;
  dVar7 = ON_2dPoint::Origin.y;
  bounds_min->x = ON_2dPoint::Origin.x;
  bounds_min->y = dVar7;
  dVar7 = ON_2dPoint::Origin.y;
  bounds_max->x = ON_2dPoint::Origin.x;
  bounds_max->y = dVar7;
  local_60 = font_height_pixels;
  ON_wString::ON_wString(&local_80,text);
  iVar2 = ON_wString::Length(&local_80);
  if (iVar2 < 1) goto LAB_0048ed2f;
  if (font->m_runtime_serial_number == 0) {
    font = ON_ManagedFonts::GetFromFontCharacteristics(&ON_ManagedFonts::List,font,true);
  }
  if (font == (ON_Font *)0x0) {
    font = &Default;
  }
  pOVar4 = FontGlyphCache(font,false);
  if (pOVar4 == (ON_FontGlyphCache *)0x0) {
    pOVar5 = &ON_FontMetrics::Unset;
  }
  else {
    pOVar5 = &pOVar4->m_normalized_metrics;
  }
  uVar6 = (uint)pOVar5->m_ascent_of_capital;
  iVar2 = pOVar5->m_line_space;
  local_a0.m_bbmin = ON_2dex::Unset;
  local_a0.m_bbmax = ON_2dex::Unset;
  local_a0.m_max_basepoint = ON_2dex::Zero;
  local_a0.m_advance = ON_2dex::Zero;
  iVar3 = ON_FontGlyph::GetGlyphListBoundingBox(text,font,&local_a0);
  *line_count = iVar3;
  if ((iVar3 < 0) || (bVar1 = ON_TextBox::IsSet(&local_a0), !bVar1)) goto LAB_0048ed2f;
  bounds_min->x = (double)local_a0.m_bbmin.i;
  bounds_min->y = (double)local_a0.m_bbmin.j;
  bounds_max->x = (double)local_a0.m_bbmax.i;
  bounds_max->y = (double)local_a0.m_bbmax.j;
  local_48 = ON_2dPoint::Origin.y;
  uStack_40 = 0;
  local_78 = ON_2dPoint::Origin.x;
  uStack_70 = 0;
  ON_2dPoint::ON_2dPoint(&local_58,ON_2dPoint::Origin.x,(double)((1 - *line_count) * iVar2));
  local_b8.x = ON_2dVector::ZeroVector.x;
  local_b8.y = ON_2dVector::ZeroVector.y;
  if (horizontal_alignment == Left) {
    local_b8.x = -local_78;
  }
  else if (horizontal_alignment == Center) {
    local_b8.x = (double)local_a0.m_max_basepoint.i * -0.5 - local_78;
  }
  else if (horizontal_alignment == Right) {
    local_b8.x = -local_78 - (double)local_a0.m_max_basepoint.i;
  }
  dVar7 = local_48;
  switch(vertical_alignment) {
  case Top:
    local_b8.y = -local_48 - (double)uVar6;
    break;
  case MiddleOfTop:
    local_b8.y = (double)uVar6 * -0.5 - local_48;
    break;
  case BottomOfTop:
    goto switchD_0048ec2e_caseD_2;
  case Middle:
    local_b8.y = (double)(int)((*line_count + -1) * iVar2 + uVar6) * 0.5;
    goto LAB_0048ec76;
  case MiddleOfBottom:
    local_b8.y = (double)uVar6 * -0.5;
LAB_0048ec76:
    local_b8.y = local_b8.y - local_58.y;
    break;
  case Bottom:
    dVar7 = local_58.y;
    goto switchD_0048ec2e_caseD_2;
  case BottomOfBoundingBox:
    dVar7 = bounds_min->y;
switchD_0048ec2e_caseD_2:
    local_b8.y = -dVar7;
  }
  ON_2dPoint::operator+=(bounds_min,&local_b8);
  ON_2dPoint::operator+=(bounds_max,&local_b8);
  dVar7 = local_60 * 0.00390625;
  if (0.0 < dVar7) {
    bounds_min->x = (double)local_a0.m_bbmin.i * dVar7;
    bounds_max->x = (double)local_a0.m_bbmax.i * dVar7;
    bounds_min->y = (double)local_a0.m_bbmin.j * dVar7;
    bounds_max->y = (double)local_a0.m_bbmax.j * dVar7;
  }
LAB_0048ed2f:
  ON_wString::~ON_wString(&local_80);
  return;
}

Assistant:

void ON_Font::GetRunBounds(
  const ON_Font& font,
  const wchar_t* text,
  double font_height_pixels,
  ON::TextHorizontalAlignment horizontal_alignment,
  ON::TextVerticalAlignment vertical_alignment,
  ON_2dPoint& bounds_min,
  ON_2dPoint& bounds_max, 
  int& line_count
)
{
  line_count = 0;
  bounds_min = ON_2dPoint::Origin;
  bounds_max = ON_2dPoint::Origin;

  ON_wString run = text;
  int textlength = run.Length();
  if(textlength < 1)
    return;

  const ON_Font* managed_font = font.ManagedFont();
  if (nullptr == managed_font)
    managed_font = &ON_Font::Default;

  const ON_FontMetrics& fm = managed_font->FontMetrics();

  const int height_of_I = fm.AscentOfCapital();
  const int height_of_LF = fm.LineSpace();

  ON_TextBox text_box;
  line_count = ON_FontGlyph::GetGlyphListBoundingBox(text, managed_font, text_box);
  if ( line_count < 0 || false == text_box.IsSet())
    return;

  bounds_min.x = text_box.m_bbmin.i;
  bounds_min.y = text_box.m_bbmin.j;

  bounds_max.x = text_box.m_bbmax.i;
  bounds_max.y = text_box.m_bbmax.j;

  // in text_box coordinate system (0.0) = left most baseline point of first line.
  const ON_2dPoint first_line_basepoint = ON_2dPoint::Origin;
  const ON_2dPoint last_line_basepoint(first_line_basepoint.x, -(line_count - 1)*height_of_LF);

  ON_2dVector offset = ON_2dVector::ZeroVector;

  switch (horizontal_alignment)
  {
  case ON::TextHorizontalAlignment::Left:
    offset.x = -first_line_basepoint.x;
    break;

  case ON::TextHorizontalAlignment::Center:
    // Text command uses m_max_basepoint (not bbmax)
    offset.x = -first_line_basepoint.x - 0.5*text_box.m_max_basepoint.i;
    break;

  case ON::TextHorizontalAlignment::Right:
    // Text command uses m_max_basepoint (not bbmax)
    offset.x = -first_line_basepoint.x - text_box.m_max_basepoint.i;
    break;
  default:
    break;
  }

  switch (vertical_alignment)
  {
  case ON::TextVerticalAlignment::Top:
    // (*,0) is at the top of an "I" on the first line.
    offset.y = -first_line_basepoint.y - height_of_I;
    break;
  case ON::TextVerticalAlignment::MiddleOfTop:
    // (*,0) is at the middle of an "I" on the first line.
    offset.y = -first_line_basepoint.y - 0.5*height_of_I;
    break;
  case ON::TextVerticalAlignment::BottomOfTop:
    // (*,0) is at the baseline of the first line.
    offset.y = -first_line_basepoint.y;
    break;

  case ON::TextVerticalAlignment::Middle:
    {
      // (*,0) is the vertical middle of lines (not vertical middle of glyph bounding box)
      double h = (line_count - 1)*height_of_LF + height_of_I;
      offset.y = -last_line_basepoint.y + 0.5*h;
    }
    break;

  case ON::TextVerticalAlignment::MiddleOfBottom:
    // (*,0) is at the middle of an "I" on the last line.
    offset.y = -last_line_basepoint.y  - 0.5*height_of_I;
    break;
  case ON::TextVerticalAlignment::Bottom:
    // (*,0) is at the basline of the last line.
    offset.y = -last_line_basepoint.y;
    break;
  case ON::TextVerticalAlignment::BottomOfBoundingBox:
    // (*,0) is on the bottom the the glyphs' bounding box
    offset.y = -bounds_min.y;
    break;
  default:
    break;
  }

  bounds_min += offset;
  bounds_max += offset;

  // scale is applied last.
  const double scale = font_height_pixels / (double)ON_Font::Constants::AnnotationFontCellHeight;
  if (scale > 0.0)
  {
    bounds_min.x = scale * text_box.m_bbmin.i;
    bounds_max.x = scale * text_box.m_bbmax.i;
    bounds_min.y = scale * text_box.m_bbmin.j;
    bounds_max.y = scale * text_box.m_bbmax.j;
  }
}